

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_string_set(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_1e4;
  operation local_1e0;
  operand local_1dc [2];
  operation local_1d4;
  operand local_1d0 [2];
  operation local_1c8 [2];
  operand local_1c0 [2];
  operation local_1b8;
  operand local_1b4 [2];
  operation local_1ac;
  operand local_1a8 [2];
  operation local_1a0 [2];
  operand local_198 [2];
  operation local_190 [4];
  operand local_180 [2];
  operation local_178 [2];
  operand local_170 [2];
  operation local_168 [2];
  operand local_160 [2];
  operation local_158;
  operand local_154 [2];
  operation local_14c;
  long local_148;
  operand local_140 [2];
  operation local_138;
  operand local_134 [2];
  operation local_12c;
  undefined1 local_128 [8];
  string not_in_bounds;
  string in_bounds;
  operand local_e0;
  operand local_dc;
  operation local_d8;
  operation local_d4;
  int local_d0;
  operand local_cc;
  operand local_c8;
  operation local_c4;
  int local_c0;
  operand local_bc;
  operand local_b8;
  operation local_b4;
  operand local_b0;
  operand local_ac;
  operation local_a8;
  operation local_a4;
  int local_a0;
  operand local_9c;
  operand local_98;
  operation local_94;
  unsigned_long local_90;
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,psVar1,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 3;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x34;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    jump_if_arg_is_not_block(code,RCX,R11,(string *)local_38);
  }
  local_7c[0] = AND;
  local_84[1] = 0xb;
  local_84[0] = NUMBER;
  local_90 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_7c,local_84 + 1,local_84,&local_90);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    jump_short_if_arg_does_not_point_to_string(code,RCX,R11,(string *)local_38);
    local_94 = TEST;
    local_98 = RDX;
    local_9c = NUMBER;
    local_a0 = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&stack0xffffffffffffff6c,&stack0xffffffffffffff68,&stack0xffffffffffffff64,
               &stack0xffffffffffffff60);
    local_a4 = JNES;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,&stack0xffffffffffffff5c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_a8 = MOV;
    local_ac = R11;
    local_b0 = RSI;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&stack0xffffffffffffff58,&stack0xffffffffffffff54,&stack0xffffffffffffff50);
    local_b4 = AND;
    local_b8 = R11;
    local_bc = NUMBER;
    local_c0 = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&stack0xffffffffffffff4c,&stack0xffffffffffffff48,&stack0xffffffffffffff44,
               &stack0xffffffffffffff40);
    local_c4 = CMP;
    local_c8 = R11;
    local_cc = NUMBER;
    local_d0 = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&stack0xffffffffffffff3c,&stack0xffffffffffffff38,&stack0xffffffffffffff34,
               &stack0xffffffffffffff30);
    local_d4 = JNES;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,&stack0xffffffffffffff2c,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  local_d8 = SAR;
  local_dc = RDX;
  local_e0 = NUMBER;
  in_bounds.field_2._12_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xffffffffffffff28,&stack0xffffffffffffff24,&stack0xffffffffffffff20,
             (int *)(in_bounds.field_2._M_local_buf + 0xc));
  psVar1 = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_((string *)((long)&not_in_bounds.field_2 + 8),psVar1,lab_00);
    psVar1 = label;
    label = label + 1;
    label_to_string_abi_cxx11_((string *)local_128,psVar1,lab_01);
    local_12c = MOV;
    local_134[1] = 9;
    local_134[0] = MEM_RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_12c,local_134 + 1,local_134);
    local_138 = MOV;
    local_140[1] = 0x18;
    local_140[0] = NUMBER;
    local_148 = 0xffffffffffffff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,long>
              (code,&local_138,local_140 + 1,local_140,&local_148);
    local_14c = AND;
    local_154[1] = 9;
    local_154[0] = R15;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,&local_14c,local_154 + 1,local_154);
    local_158 = SHL;
    local_160[1] = 9;
    local_160[0] = NUMBER;
    local_168[1] = 3;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_158,local_160 + 1,local_160,(int *)(local_168 + 1));
    local_168[0] = CMP;
    local_170[1] = 0xc;
    local_170[0] = RAX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_168,local_170 + 1,local_170);
    local_178[1] = 0x3c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_178 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    local_178[0] = CMP;
    local_180[1] = 0xc;
    local_180[0] = NUMBER;
    local_190[3] = 0;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_178,local_180 + 1,local_180,(int *)(local_190 + 3));
    local_190[2] = 0x3c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_190 + 2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&not_in_bounds.field_2 + 8));
    error_label(code,(string *)local_128,re_string_set_out_of_bounds);
    local_190[1] = 0x3e;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_190 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&not_in_bounds.field_2 + 8));
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::~string((string *)(not_in_bounds.field_2._M_local_buf + 8));
  }
  local_190[0] = ADD;
  local_198[1] = 0xc;
  local_198[0] = NUMBER;
  local_1a0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_190,local_198 + 1,local_198,(int *)(local_1a0 + 1));
  local_1a0[0] = ADD;
  local_1a8[1] = 0xb;
  local_1a8[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1a0,local_1a8 + 1,local_1a8);
  local_1ac = MOV;
  local_1b4[1] = 9;
  local_1b4[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1ac,local_1b4 + 1,local_1b4);
  local_1b8 = SHR;
  local_1c0[1] = 9;
  local_1c0[0] = NUMBER;
  local_1c8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1b8,local_1c0 + 1,local_1c0,(int *)(local_1c8 + 1));
  local_1c8[0] = MOV;
  local_1d0[1] = 0x2b;
  local_1d0[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1c8,local_1d0 + 1,local_1d0);
  local_1d4 = MOV;
  local_1dc[1] = 9;
  local_1dc[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_1d4,local_1dc + 1,local_1dc);
  local_1e0 = JMP;
  local_1e4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_1e0,&local_1e4);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_string_set_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_string_set(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
    code.add(asmcode::JNE, error);
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error); // assembly can jump short, but vm cannot
    }
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // here check whether it is a string and a char
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_string(code, asmcode::RCX, asmcode::R11, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RSI);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::SAR, asmcode::RDX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    {
    // optionally, check whether rdx is in bounds.
    std::string in_bounds = label_to_string(label++);
    std::string not_in_bounds = label_to_string(label++);
    code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RCX);
    code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, block_size_mask);
    code.add(asmcode::AND, asmcode::RAX, asmcode::R15);
    code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::RAX);
    code.add(asmcode::JGES, not_in_bounds);
    code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, 0);
    code.add(asmcode::JGES, in_bounds);
    error_label(code, not_in_bounds, re_string_set_out_of_bounds);
    code.add(asmcode::LABEL, in_bounds);
    }

  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, 8); // increase 8 for header
  code.add(asmcode::ADD, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::SHR, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::BYTE_MEM_RCX, asmcode::AL);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RSI);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_string_set_contract_violation);
    }
  }